

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O2

void conv_fft(conv_object obj,double *inp1,double *inp2,double *oup)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  double *inp;
  double *inp_00;
  fft_data *inp_01;
  fft_data *oup_00;
  fft_data *oup_01;
  double *oup_02;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  size_t __size;
  ulong uVar9;
  double dVar10;
  double dVar11;
  
  uVar3 = obj->clen;
  iVar4 = obj->ilen1;
  iVar5 = obj->ilen2;
  __size = (long)(int)uVar3 << 4;
  inp = (double *)malloc(__size);
  inp_00 = (double *)malloc(__size);
  inp_01 = (fft_data *)malloc(__size);
  oup_00 = (fft_data *)malloc(__size);
  oup_01 = (fft_data *)malloc(__size);
  oup_02 = (double *)malloc(__size);
  uVar6 = 0;
  uVar9 = 0;
  if (0 < (int)uVar3) {
    uVar9 = (ulong)uVar3;
  }
  for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
    dVar10 = 0.0;
    dVar11 = 0.0;
    if ((long)uVar6 < (long)iVar4) {
      dVar11 = inp1[uVar6];
    }
    inp[uVar6] = dVar11;
    if ((long)uVar6 < (long)iVar5) {
      dVar10 = inp2[uVar6];
    }
    inp_00[uVar6] = dVar10;
  }
  fft_r2c_exec(obj->fobj,inp,oup_00);
  fft_r2c_exec(obj->fobj,inp_00,oup_01);
  for (lVar7 = 0; uVar9 * 0x10 != lVar7; lVar7 = lVar7 + 0x10) {
    dVar11 = *(double *)((long)&oup_00->re + lVar7);
    dVar10 = *(double *)((long)&oup_00->im + lVar7);
    dVar1 = *(double *)((long)&oup_01->re + lVar7);
    dVar2 = *(double *)((long)&oup_01->im + lVar7);
    *(double *)((long)&inp_01->re + lVar7) = dVar11 * dVar1 - dVar2 * dVar10;
    *(double *)((long)&inp_01->im + lVar7) = dVar10 * dVar1 + dVar11 * dVar2;
  }
  uVar8 = iVar4 + -1 + iVar5;
  fft_c2r_exec(obj->iobj,inp_01,oup_02);
  uVar9 = 0;
  uVar6 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar6 = uVar9;
  }
  for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
    oup[uVar9] = oup_02[uVar9] / (double)(int)uVar3;
  }
  free(inp);
  free(inp_00);
  free(inp_01);
  free(oup_00);
  free(oup_01);
  free(oup_02);
  return;
}

Assistant:

void conv_fft(const conv_object obj,fft_type *inp1,fft_type *inp2,fft_type *oup) {
	int i,N,L1,L2,ls;
	fft_type* a;
	fft_type* b;
	fft_data* c;
	fft_data* ao;
	fft_data* bo;
	fft_type* co;
	
	N = obj->clen;
	L1 = obj->ilen1;
	L2 = obj->ilen2;
	ls = L1 + L2 - 1;
	
	a = (fft_type*) malloc (sizeof(fft_data) * N);
	b = (fft_type*) malloc (sizeof(fft_data) * N);
	c = (fft_data*) malloc (sizeof(fft_data) * N);
	ao = (fft_data*) malloc (sizeof(fft_data) * N);
	bo = (fft_data*) malloc (sizeof(fft_data) * N);
	co = (fft_type*) malloc (sizeof(fft_data) * N);
	
	for (i = 0; i < N;i++) {
		if (i < L1) {
			a[i] = inp1[i];
		} else {
			a[i] = 0.0;
		}
		
		if (i < L2) {
			b[i] = inp2[i];
		} else {
			b[i] = 0.0;
		}
	
	}
	
	fft_r2c_exec(obj->fobj,a,ao);
	fft_r2c_exec(obj->fobj,b,bo);
	
	for (i = 0; i < N;i++) {
		c[i].re = ao[i].re * bo[i].re - ao[i].im * bo[i].im;
		c[i].im = ao[i].im * bo[i].re + ao[i].re * bo[i].im;
	}
	
	fft_c2r_exec(obj->iobj,c,co);
	
	for (i = 0; i < ls;i++) {
		oup[i] = co[i]/N;
	}
	
	free(a);
	free(b);
	free(c);
	free(ao);
	free(bo);
	free(co);
	
	
}